

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O1

void __thiscall hwnet::TCPConnector::Do(TCPConnector *this)

{
  int iVar1;
  _Manager_operation extraout_EDX;
  undefined1 auStack_68 [8];
  ConnectCallback connectCallback;
  ErrorCallback errorCallback;
  
  connectCallback.super__Function_base._M_functor._8_8_ = 0;
  connectCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_68 = (undefined1  [8])0x0;
  connectCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errorCallback.super__Function_base._M_functor._8_8_ = 0;
  errorCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  connectCallback._M_invoker = (_Invoker_type)0x0;
  errorCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (this->gotError == true) {
      std::function<void_(int,_const_hwnet::Addr_&)>::operator=
                ((function<void_(int,_const_hwnet::Addr_&)> *)&connectCallback._M_invoker,
                 &this->errorCallback_);
      iVar1 = -1;
      close(this->fd);
    }
    else {
      std::function<void_(int)>::operator=
                ((function<void_(int)> *)auStack_68,&this->connectCallback_);
      iVar1 = this->fd;
      this->fd = -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    if (errorCallback.super__Function_base._M_functor._8_8_ == 0) {
      if (connectCallback.super__Function_base._M_functor._8_8_ != 0) {
        errorCallback._M_invoker._4_4_ = iVar1;
        (*connectCallback.super__Function_base._M_manager)
                  ((_Any_data *)auStack_68,(_Any_data *)((long)&errorCallback._M_invoker + 4),
                   extraout_EDX);
      }
    }
    else {
      errorCallback._M_invoker._4_4_ = this->err;
      (*errorCallback.super__Function_base._M_manager)
                ((_Any_data *)&connectCallback._M_invoker,
                 (_Any_data *)((long)&errorCallback._M_invoker + 4),(int)this + 0x2c);
    }
    if (errorCallback.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)errorCallback.super__Function_base._M_functor._8_8_)
                (&connectCallback._M_invoker,&connectCallback._M_invoker,3);
    }
    if (connectCallback.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)connectCallback.super__Function_base._M_functor._8_8_)(auStack_68,auStack_68,3);
    }
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void TCPConnector::Do() {
	int fd_ = -1;
	ConnectCallback connectCallback = nullptr;
	ErrorCallback   errorCallback = nullptr;

	{
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this->gotError) {
			errorCallback = this->errorCallback_;
			::close(this->fd);
		} else {	
			connectCallback = this->connectCallback_;
			fd_ = this->fd;
			this->fd = -1;
		}
	}

	if(nullptr != errorCallback) {
		errorCallback(this->err,this->remoteAddr);
	} else if(nullptr != connectCallback) {
		connectCallback(fd_);
	}
}